

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall logger::OutputWorker::Loop(OutputWorker *this)

{
  bool bVar1;
  long in_RDI;
  QueuedMessage qm;
  string terminatingMessage;
  QueuedMessage qm_1;
  string str;
  ostringstream oss;
  QueuedMessage *log;
  iterator __end2;
  iterator __begin2;
  list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
  *__range2;
  unique_lock<std::mutex> locker;
  bool flushRequested;
  int overrun;
  string *in_stack_fffffffffffffd68;
  allocator *message;
  unique_lock<std::mutex> *in_stack_fffffffffffffd70;
  ostringstream *in_stack_fffffffffffffd78;
  Level level;
  QueuedMessage *in_stack_fffffffffffffd80;
  allocator local_239;
  string local_238 [80];
  string local_1e8 [48];
  ostringstream local_1b8 [256];
  QueuedMessage *in_stack_ffffffffffffff48;
  OutputWorker *in_stack_ffffffffffffff50;
  _Self local_38;
  _Self local_30;
  long local_28;
  byte local_d;
  __int_type local_c;
  
  while (bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffd78),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    local_c = 0;
    local_d = 0;
    std::unique_lock<std::mutex>::unique_lock
              (in_stack_fffffffffffffd70,(mutex_type *)in_stack_fffffffffffffd68);
    bVar1 = std::__cxx11::
            list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
            ::empty((list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
                     *)(in_RDI + 0x80));
    if (((bVar1) &&
        (bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffd78),
        !bVar1)) &&
       (bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffd78),
       !bVar1)) {
      std::condition_variable::wait((unique_lock *)(in_RDI + 0x50));
    }
    std::
    swap<logger::OutputWorker::QueuedMessage,std::allocator<logger::OutputWorker::QueuedMessage>>
              ((list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
                *)in_stack_fffffffffffffd70,
               (list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
                *)in_stack_fffffffffffffd68);
    local_c = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base<int> *)in_stack_fffffffffffffd78);
    std::__atomic_base<int>::operator=
              ((__atomic_base<int> *)in_stack_fffffffffffffd78,
               (__int_type)((ulong)in_stack_fffffffffffffd70 >> 0x20));
    local_d = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffd78);
    std::atomic<bool>::operator=
              ((atomic<bool> *)in_stack_fffffffffffffd70,
               SUB81((ulong)in_stack_fffffffffffffd68 >> 0x38,0));
    std::unique_lock<std::mutex>::~unique_lock(in_stack_fffffffffffffd70);
    local_28 = in_RDI + 0x98;
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
         ::begin((list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
                  *)in_stack_fffffffffffffd68);
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
         ::end((list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
                *)in_stack_fffffffffffffd68);
    while (bVar1 = std::operator!=(&local_30,&local_38), bVar1) {
      std::_List_iterator<logger::OutputWorker::QueuedMessage>::operator*
                ((_List_iterator<logger::OutputWorker::QueuedMessage> *)0x10c03d);
      Log(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      std::_List_iterator<logger::OutputWorker::QueuedMessage>::operator++(&local_30);
    }
    if (0 < local_c) {
      in_stack_fffffffffffffd78 = local_1b8;
      std::__cxx11::ostringstream::ostringstream(in_stack_fffffffffffffd78);
      in_stack_fffffffffffffd80 =
           (QueuedMessage *)
           std::operator<<((ostream *)in_stack_fffffffffffffd78,"Queue overrun. Lost ");
      in_stack_fffffffffffffd70 =
           (unique_lock<std::mutex> *)
           std::ostream::operator<<((ostream *)in_stack_fffffffffffffd80,local_c);
      std::operator<<((ostream *)in_stack_fffffffffffffd70," log messages");
      std::__cxx11::ostringstream::str();
      QueuedMessage::QueuedMessage
                (in_stack_fffffffffffffd80,(Level)((ulong)in_stack_fffffffffffffd78 >> 0x20),
                 (char *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      Log(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      QueuedMessage::~QueuedMessage((QueuedMessage *)0x10c124);
      std::__cxx11::string::~string(local_1e8);
      std::__cxx11::ostringstream::~ostringstream(local_1b8);
    }
    std::__cxx11::
    list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
    ::clear((list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
             *)in_stack_fffffffffffffd70);
    if ((local_d & 1) != 0) {
      std::condition_variable::notify_all();
    }
  }
  message = &local_239;
  std::allocator<char>::allocator();
  level = (Level)((ulong)in_stack_fffffffffffffd78 >> 0x20);
  std::__cxx11::string::string(local_238,"Terminating",message);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  QueuedMessage::QueuedMessage
            (in_stack_fffffffffffffd80,level,(char *)in_stack_fffffffffffffd70,(string *)message);
  Log(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  QueuedMessage::~QueuedMessage((QueuedMessage *)0x10c244);
  std::__cxx11::string::~string(local_238);
  return;
}

Assistant:

void OutputWorker::Loop()
{
    while (!Terminated)
    {
        int overrun = 0;
        bool flushRequested = false;
        {
            // unique_lock used since QueueCondition.wait requires it
            std::unique_lock<std::mutex> locker(QueueLock);

            if (QueuePublic.empty() && !FlushRequested && !Terminated)
                QueueCondition.wait(locker);

            std::swap(QueuePublic, QueuePrivate);

#if !defined(LOGGER_NEVER_DROP)
            overrun = Overrun;
            Overrun = 0;
#endif // LOGGER_NEVER_DROP

            flushRequested = FlushRequested;
            FlushRequested = false;
        }

        for (auto& log : QueuePrivate)
            Log(log);

        // Handle log message overrun
        if (overrun > 0)
        {
            std::ostringstream oss;
            oss << "Queue overrun. Lost " << overrun << " log messages";
            std::string str = oss.str();
            QueuedMessage qm(Level::Error, "Logger", str);
            Log(qm);
        }

        QueuePrivate.clear();

        if (flushRequested)
            FlushCondition.notify_all();
    }

    // Log out that logger is terminating
    std::string terminatingMessage = "Terminating";
    QueuedMessage qm(Level::Info, "Logger", terminatingMessage);
    Log(qm);
}